

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigFanout.c
# Opt level: O3

void Aig_ObjRemoveFanout(Aig_Man_t *p,Aig_Obj_t *pObj,Aig_Obj_t *pFanout)

{
  uint uVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  
  piVar2 = p->pFanData;
  if (piVar2 == (int *)0x0) {
LAB_006bebdb:
    __assert_fail("p->pFanData && pObj->Id < p->nFansAlloc && pFanout->Id < p->nFansAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigFanout.c"
                  ,0x9d,"void Aig_ObjRemoveFanout(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  lVar3 = (long)pObj->Id;
  if ((p->nFansAlloc <= pObj->Id) || (iVar4 = pFanout->Id, p->nFansAlloc <= iVar4))
  goto LAB_006bebdb;
  if ((((uint)pFanout | (uint)pObj) & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj) && !Aig_IsComplement(pFanout)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigFanout.c"
                  ,0x9e,"void Aig_ObjRemoveFanout(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if (iVar4 < 1) {
    __assert_fail("pFanout->Id > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigFanout.c"
                  ,0x9f,"void Aig_ObjRemoveFanout(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if ((Aig_Obj_t *)((ulong)pFanout->pFanin0 & 0xfffffffffffffffe) == pObj) {
    uVar8 = 0;
  }
  else {
    uVar8 = 1;
    if ((Aig_Obj_t *)((ulong)pFanout->pFanin1 & 0xfffffffffffffffe) != pObj) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                    ,0x150,"int Aig_ObjWhatFanin(Aig_Obj_t *, Aig_Obj_t *)");
    }
  }
  uVar1 = uVar8 + iVar4 * 2;
  iVar4 = iVar4 * 2 >> 1;
  uVar6 = (ulong)uVar8;
  uVar8 = piVar2[(long)(iVar4 * 5) + uVar6 + 3];
  lVar5 = (long)(((int)uVar8 >> 1) * 5);
  uVar9 = uVar8 & 1;
  if (piVar2[lVar5 + (ulong)uVar9 + 1] != uVar1) {
    __assert_fail("*pPrev == iFan",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigFanout.c"
                  ,0xa5,"void Aig_ObjRemoveFanout(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  uVar12 = piVar2[(long)(iVar4 * 5) + uVar6 + 1];
  lVar10 = (long)(((int)uVar12 >> 1) * 5);
  uVar11 = uVar12 & 1;
  if (piVar2[lVar10 + (ulong)uVar11 + 3] != uVar1) {
    __assert_fail("*pNext == iFan",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigFanout.c"
                  ,0xa6,"void Aig_ObjRemoveFanout(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if (piVar2[lVar3 * 5] < 1) {
    __assert_fail("*pFirst > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigFanout.c"
                  ,0xa8,"void Aig_ObjRemoveFanout(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if (piVar2[lVar3 * 5] == uVar1) {
    if (uVar8 == uVar1) {
      iVar7 = 0;
      piVar2[lVar3 * 5] = 0;
      piVar2[lVar5 + (ulong)uVar9 + 1] = 0;
      goto LAB_006bebc2;
    }
    piVar2[lVar3 * 5] = uVar8;
    uVar12 = piVar2[(long)(iVar4 * 5) + uVar6 + 1];
  }
  piVar2[lVar5 + (ulong)uVar9 + 1] = uVar12;
  iVar7 = piVar2[(long)(iVar4 * 5) + uVar6 + 3];
LAB_006bebc2:
  piVar2[lVar10 + (ulong)uVar11 + 3] = iVar7;
  piVar2[(long)(iVar4 * 5) + uVar6 + 1] = 0;
  piVar2[(long)(iVar4 * 5) + uVar6 + 3] = 0;
  return;
}

Assistant:

void Aig_ObjRemoveFanout( Aig_Man_t * p, Aig_Obj_t * pObj, Aig_Obj_t * pFanout )
{
    int iFan, * pFirst, * pPrevC, * pNextC, * pPrev, * pNext;
    assert( p->pFanData && pObj->Id < p->nFansAlloc && pFanout->Id < p->nFansAlloc );
    assert( !Aig_IsComplement(pObj) && !Aig_IsComplement(pFanout) );
    assert( pFanout->Id > 0 );
    iFan   = Aig_FanoutCreate( pFanout->Id, Aig_ObjWhatFanin(pFanout, pObj) );
    pPrevC = Aig_FanoutPrev( p->pFanData, iFan );
    pNextC = Aig_FanoutNext( p->pFanData, iFan );
    pPrev  = Aig_FanoutPrev( p->pFanData, *pNextC );
    pNext  = Aig_FanoutNext( p->pFanData, *pPrevC );
    assert( *pPrev == iFan );
    assert( *pNext == iFan );
    pFirst = Aig_FanoutObj( p->pFanData, pObj->Id );
    assert( *pFirst > 0 );
    if ( *pFirst == iFan )
    {
        if ( *pNextC == iFan )
        {
            *pFirst = 0;
            *pPrev  = 0;
            *pNext  = 0;
            *pPrevC = 0;
            *pNextC = 0;
            return;
        }
        *pFirst = *pNextC;
    }
    *pPrev  = *pPrevC;
    *pNext  = *pNextC;
    *pPrevC = 0;
    *pNextC = 0;
}